

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O2

void __thiscall
Centaurus::DryParserEM64T<unsigned_char>::DryParserEM64T
          (DryParserEM64T<unsigned_char> *this,Grammar<unsigned_char> *grammar,Logger *logger)

{
  CodeHolder *this_00;
  Operand_ *o0;
  mapped_type *pmVar1;
  socklen_t __len;
  MyConstPool *o1;
  sockaddr *__addr;
  __node_base *p_Var2;
  __node_base *p_Var3;
  Label rejectlabel;
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  machine_map;
  CompositeATN<unsigned_char> catn;
  undefined1 local_218 [24];
  X86Assembler as;
  MyConstPool pool;
  
  (this->super_IParser)._vptr_IParser = (_func_int **)&PTR__DryParserEM64T_001926e8;
  asmjit::JitRuntime::JitRuntime(&this->m_runtime);
  this_00 = &this->m_code;
  asmjit::CodeHolder::CodeHolder(this_00);
  asmjit::CodeHolder::init
            (this_00,(EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (logger != (Logger *)0x0) {
    asmjit::CodeHolder::setLogger(this_00,logger);
  }
  asmjit::X86Assembler::X86Assembler(&as,this_00);
  machine_map._M_h._M_buckets = &machine_map._M_h._M_single_bucket;
  machine_map._M_h._M_bucket_count = 1;
  machine_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  machine_map._M_h._M_element_count = 0;
  machine_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  machine_map._M_h._M_rehash_policy._M_next_resize = 0;
  machine_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  emit_parser_prolog(&as);
  o1 = &pool;
  pool.m_as = (X86Assembler *)&DAT_00000032;
  pool.m_zone._ptr._4_4_ = 4;
  pool.m_zone._ptr._0_4_ = 0x20;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)&as,0x189,(Operand_ *)(asmjit::x86OpData + 0x4e0),(Operand_ *)o1);
  MyConstPool::MyConstPool(&pool,&as);
  local_218._0_8_ = 0x110000149;
  local_218._8_8_ = 0;
  MyConstPool::load_charclass_filter<unsigned_char>
            (&pool,(X86Xmm *)local_218,(CharClass<unsigned_char> *)m_skipfilter);
  asmjit::Assembler::newLabel((Assembler *)&rejectlabel);
  p_Var2 = &(grammar->m_networks)._M_h._M_before_begin;
  p_Var3 = p_Var2;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    asmjit::Assembler::newLabel((Assembler *)&catn);
    std::
    _Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,asmjit::Label>,std::allocator<std::pair<Centaurus::Identifier_const,asmjit::Label>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<Centaurus::Identifier_const&,asmjit::Label>
              ((_Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,asmjit::Label>,std::allocator<std::pair<Centaurus::Identifier_const,asmjit::Label>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&machine_map,p_Var3 + 1,(Assembler *)&catn);
  }
  o0 = (Operand_ *)
       std::__detail::
       _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
       ::operator[]((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)&machine_map,&grammar->m_root_id);
  asmjit::CodeEmitter::emit((CodeEmitter *)&as,0x3b,o0);
  emit_parser_epilog(&as,&rejectlabel);
  CompositeATN<unsigned_char>::CompositeATN(&catn,grammar);
  while( true ) {
    __len = (socklen_t)o1;
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) break;
    pmVar1 = std::__detail::
             _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&machine_map,(key_type *)(p_Var2 + 1));
    asmjit::Assembler::bind(&as.super_Assembler,(int)pmVar1,__addr,__len);
    o1 = (MyConstPool *)&catn;
    emit_machine((X86Assembler *)&as.super_Assembler,(ATNMachine<unsigned_char> *)(p_Var2 + 6),
                 &machine_map,&catn,(key_type *)(p_Var2 + 1),&rejectlabel,&pool);
  }
  (*((pool.m_as)->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[0xd])
            (pool.m_as,&pool.m_label,&pool.m_pool);
  asmjit::CodeEmitter::finalize((CodeEmitter *)&as);
  CompositeATN<unsigned_char>::~CompositeATN(&catn);
  MyConstPool::~MyConstPool(&pool);
  std::
  _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_asmjit::Label>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&machine_map._M_h);
  asmjit::X86Assembler::~X86Assembler(&as);
  return;
}

Assistant:

DryParserEM64T<TCHAR>::DryParserEM64T(const Grammar<TCHAR>& grammar, asmjit::Logger *logger)
{
    m_code.init(m_runtime.getCodeInfo());
    if (logger != NULL)
        m_code.setLogger(logger);

    asmjit::X86Assembler as(&m_code);

    std::unordered_map<Identifier, asmjit::Label> machine_map;

    emit_parser_prolog(as);

    as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));

    MyConstPool pool(as);

    pool.load_charclass_filter(PATTERN_REG, m_skipfilter);

    asmjit::Label rejectlabel = as.newLabel();

    {
        for (const auto& p : grammar.get_machines())
        {
            machine_map.emplace(p.first, as.newLabel());
        }

        as.call(machine_map[grammar.get_root_id()]);
    }

    emit_parser_epilog(as, rejectlabel);

    CompositeATN<TCHAR> catn(grammar);

    for (const auto& p : grammar.get_machines())
    {
        as.bind(machine_map[p.first]);

        emit_machine(as, p.second, machine_map, catn, p.first, rejectlabel, pool);
    }

    pool.embed();

    as.finalize();
}